

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O3

SAM_hdr_type * sam_hdr_find(SAM_hdr *hdr,char *type,char *ID_key,char *ID_value)

{
  char cVar1;
  khint_t kVar2;
  kh_m_s2i_t *pkVar3;
  kh_sam_hdr_t *pkVar4;
  SAM_hdr_item_s *pSVar5;
  khint32_t *pkVar6;
  SAM_hdr_item_s **ppSVar7;
  char cVar8;
  uint uVar9;
  int iVar10;
  SAM_hdr_item_s *pSVar11;
  SAM_hdr_type **ppSVar12;
  byte bVar13;
  char *pcVar14;
  SAM_hdr_tag *pSVar15;
  char *pcVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  
  cVar8 = *type;
  cVar1 = type[1];
  if (ID_key != (char *)0x0) {
    if (cVar1 == 'Q' && cVar8 == 'S') {
      if ((*ID_key == 'S') && (ID_key[1] == 'N')) {
        pkVar3 = hdr->ref_hash;
        kVar2 = pkVar3->n_buckets;
        if (kVar2 == 0) {
          uVar20 = 0;
        }
        else {
          uVar18 = (uint)*ID_value;
          if (*ID_value == '\0') {
            uVar18 = 0;
          }
          else {
            cVar8 = ID_value[1];
            if (cVar8 != '\0') {
              pcVar14 = ID_value + 2;
              do {
                uVar18 = (int)cVar8 + uVar18 * 0x1f;
                cVar8 = *pcVar14;
                pcVar14 = pcVar14 + 1;
              } while (cVar8 != '\0');
            }
          }
          uVar18 = uVar18 & kVar2 - 1;
          pkVar6 = pkVar3->flags;
          iVar19 = 1;
          uVar20 = uVar18;
          while( true ) {
            uVar17 = pkVar6[uVar20 >> 4];
            bVar13 = (char)uVar20 * '\x02' & 0x1e;
            uVar9 = uVar17 >> bVar13;
            if (((uVar9 & 2) != 0) ||
               (((uVar9 & 1) == 0 && (iVar10 = strcmp(pkVar3->keys[uVar20],ID_value), iVar10 == 0)))
               ) break;
            uVar20 = uVar20 + iVar19 & kVar2 - 1;
            iVar19 = iVar19 + 1;
            if (uVar20 == uVar18) {
              return (SAM_hdr_type *)0x0;
            }
          }
          if ((uVar17 >> bVar13 & 3) != 0) {
            uVar20 = kVar2;
          }
        }
        if (uVar20 == kVar2) {
          return (SAM_hdr_type *)0x0;
        }
        ppSVar12 = &hdr->ref[pkVar3->vals[uVar20]].ty;
        goto LAB_00138971;
      }
    }
    else if (cVar8 == 'P') {
      if (((cVar1 == 'G') && (*ID_key == 'I')) && (ID_key[1] == 'D')) {
        pkVar3 = hdr->pg_hash;
        kVar2 = pkVar3->n_buckets;
        if (kVar2 == 0) {
          uVar20 = 0;
        }
        else {
          uVar18 = (uint)*ID_value;
          if (*ID_value == '\0') {
            uVar18 = 0;
          }
          else {
            cVar8 = ID_value[1];
            if (cVar8 != '\0') {
              pcVar14 = ID_value + 2;
              do {
                uVar18 = (int)cVar8 + uVar18 * 0x1f;
                cVar8 = *pcVar14;
                pcVar14 = pcVar14 + 1;
              } while (cVar8 != '\0');
            }
          }
          uVar18 = uVar18 & kVar2 - 1;
          pkVar6 = pkVar3->flags;
          iVar19 = 1;
          uVar20 = uVar18;
          while( true ) {
            uVar17 = pkVar6[uVar20 >> 4];
            bVar13 = (char)uVar20 * '\x02' & 0x1e;
            uVar9 = uVar17 >> bVar13;
            if (((uVar9 & 2) != 0) ||
               (((uVar9 & 1) == 0 && (iVar10 = strcmp(pkVar3->keys[uVar20],ID_value), iVar10 == 0)))
               ) break;
            uVar20 = uVar20 + iVar19 & kVar2 - 1;
            iVar19 = iVar19 + 1;
            if (uVar20 == uVar18) {
              return (SAM_hdr_type *)0x0;
            }
          }
          if ((uVar17 >> bVar13 & 3) != 0) {
            uVar20 = kVar2;
          }
        }
        if (uVar20 == kVar2) {
          return (SAM_hdr_type *)0x0;
        }
        ppSVar12 = &hdr->pg[pkVar3->vals[uVar20]].ty;
        goto LAB_00138971;
      }
    }
    else if (((cVar8 == 'R') && (cVar1 == 'G')) && ((*ID_key == 'I' && (ID_key[1] == 'D')))) {
      pkVar3 = hdr->rg_hash;
      kVar2 = pkVar3->n_buckets;
      if (kVar2 == 0) {
        uVar20 = 0;
      }
      else {
        uVar18 = (uint)*ID_value;
        if (*ID_value == '\0') {
          uVar18 = 0;
        }
        else {
          cVar8 = ID_value[1];
          if (cVar8 != '\0') {
            pcVar14 = ID_value + 2;
            do {
              uVar18 = (int)cVar8 + uVar18 * 0x1f;
              cVar8 = *pcVar14;
              pcVar14 = pcVar14 + 1;
            } while (cVar8 != '\0');
          }
        }
        uVar18 = uVar18 & kVar2 - 1;
        pkVar6 = pkVar3->flags;
        iVar19 = 1;
        uVar20 = uVar18;
        while( true ) {
          uVar17 = pkVar6[uVar20 >> 4];
          bVar13 = (char)uVar20 * '\x02' & 0x1e;
          uVar9 = uVar17 >> bVar13;
          if (((uVar9 & 2) != 0) ||
             (((uVar9 & 1) == 0 && (iVar10 = strcmp(pkVar3->keys[uVar20],ID_value), iVar10 == 0))))
          break;
          uVar20 = uVar20 + iVar19 & kVar2 - 1;
          iVar19 = iVar19 + 1;
          if (uVar20 == uVar18) {
            return (SAM_hdr_type *)0x0;
          }
        }
        if ((uVar17 >> bVar13 & 3) != 0) {
          uVar20 = kVar2;
        }
      }
      if (uVar20 == kVar2) {
        return (SAM_hdr_type *)0x0;
      }
      ppSVar12 = &hdr->rg[pkVar3->vals[uVar20]].ty;
LAB_00138971:
      return *ppSVar12;
    }
  }
  pkVar4 = hdr->h;
  kVar2 = pkVar4->n_buckets;
  if (kVar2 == 0) {
    uVar18 = 0;
LAB_00138818:
    if (uVar18 != kVar2) {
      pSVar5 = pkVar4->vals[uVar18];
      pSVar11 = pSVar5;
      if (ID_key == (char *)0x0) {
        return pSVar5;
      }
      do {
        pSVar15 = pSVar11->tag;
        if (pSVar15 != (SAM_hdr_tag *)0x0) {
          do {
            pcVar14 = pSVar15->str;
            if ((*pcVar14 == *ID_key) && (pcVar14[1] == ID_key[1])) {
              cVar8 = pcVar14[3];
              pcVar16 = ID_value;
              if (cVar8 != '\0') {
                pcVar14 = pcVar14 + 4;
                do {
                  if (cVar8 != *pcVar16) goto LAB_00138890;
                  pcVar16 = pcVar16 + 1;
                  cVar8 = *pcVar14;
                  pcVar14 = pcVar14 + 1;
                } while (cVar8 != '\0');
              }
              if (*pcVar16 == '\0') {
                return pSVar11;
              }
            }
LAB_00138890:
            pSVar15 = pSVar15->next;
          } while (pSVar15 != (SAM_hdr_tag_s *)0x0);
        }
        ppSVar7 = &pSVar11->next;
        pSVar11 = *ppSVar7;
      } while (*ppSVar7 != pSVar5);
    }
  }
  else {
    uVar20 = (int)cVar8 << 8 | (int)cVar1;
    uVar17 = kVar2 - 1 & uVar20;
    iVar19 = 1;
    uVar18 = uVar17;
    do {
      bVar13 = (char)uVar18 * '\x02' & 0x1e;
      uVar9 = pkVar4->flags[uVar18 >> 4] >> bVar13;
      if (((uVar9 & 2) != 0) || (((uVar9 & 1) == 0 && (pkVar4->keys[uVar18] == uVar20)))) {
        if ((pkVar4->flags[uVar18 >> 4] >> bVar13 & 3) != 0) {
          uVar18 = kVar2;
        }
        goto LAB_00138818;
      }
      uVar18 = uVar18 + iVar19 & kVar2 - 1;
      iVar19 = iVar19 + 1;
    } while (uVar18 != uVar17);
  }
  return (SAM_hdr_type *)0x0;
}

Assistant:

SAM_hdr_type *sam_hdr_find(SAM_hdr *hdr, char *type,
			   char *ID_key, char *ID_value) {
    SAM_hdr_type *t1, *t2;
    int itype = (type[0]<<8)|(type[1]);
    khint_t k;

    /* Special case for types we have prebuilt hashes on */
    if (ID_key) {
	if (type[0]   == 'S' && type[1]   == 'Q' &&
	    ID_key[0] == 'S' && ID_key[1] == 'N') {
	    k = kh_get(m_s2i, hdr->ref_hash, ID_value);
	    return k != kh_end(hdr->ref_hash)
		? hdr->ref[kh_val(hdr->ref_hash, k)].ty
		: NULL;
	}

	if (type[0]   == 'R' && type[1]   == 'G' &&
	    ID_key[0] == 'I' && ID_key[1] == 'D') {
	    k = kh_get(m_s2i, hdr->rg_hash, ID_value);
	    return k != kh_end(hdr->rg_hash)
		? hdr->rg[kh_val(hdr->rg_hash, k)].ty
		: NULL;
	}

	if (type[0]   == 'P' && type[1]   == 'G' &&
	    ID_key[0] == 'I' && ID_key[1] == 'D') {
	    k = kh_get(m_s2i, hdr->pg_hash, ID_value);
	    return k != kh_end(hdr->pg_hash)
		? hdr->pg[kh_val(hdr->pg_hash, k)].ty
		: NULL;
	}
    }

    k = kh_get(sam_hdr, hdr->h, itype);
    if (k == kh_end(hdr->h))
	return NULL;
    
    if (!ID_key)
	return kh_val(hdr->h, k);

    t1 = t2 = kh_val(hdr->h, k);
    do {
	SAM_hdr_tag *tag;
	for (tag = t1->tag; tag; tag = tag->next) {
	    if (tag->str[0] == ID_key[0] && tag->str[1] == ID_key[1]) {
		char *cp1 = tag->str+3;
		char *cp2 = ID_value;
		while (*cp1 && *cp1 == *cp2)
		    cp1++, cp2++;
		if (*cp2 || *cp1)
		    continue;
		return t1;
	    }
	}
	t1 = t1->next;
    } while (t1 != t2);

    return NULL;
}